

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t rar5_read_header(archive_read *a,archive_entry *entry)

{
  int *piVar1;
  long lVar2;
  wchar_t wVar3;
  int *piVar4;
  int64_t iVar5;
  void *pvVar6;
  long lVar7;
  long request;
  long request_00;
  ulong min;
  bool bVar8;
  char signature [8];
  long local_40;
  long local_38;
  
  piVar1 = (int *)a->format->data;
  if (*piVar1 == 0) {
    (a->archive).archive_format = 0x100000;
    (a->archive).archive_format_name = "RAR5";
    piVar4 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
    if ((piVar4 != (int *)0x0) &&
       ((((char)*piVar4 == 'M' && (*(char *)((long)piVar4 + 1) == 'Z')) || (*piVar4 == 0x464c457f)))
       ) {
      local_38 = 0x1071a21726152;
      min = 0x1000;
      lVar7 = 0;
      do {
        while( true ) {
          if (0x80000 < min + lVar7) goto LAB_0062d6fe;
          pvVar6 = __archive_read_ahead(a,min,&local_40);
          if (pvVar6 != (void *)0x0) break;
          bVar8 = min < 0x80;
          min = min >> 1;
          if (bVar8) goto LAB_0062d7e9;
        }
        if (local_40 < 0x40) {
LAB_0062d7e9:
          archive_set_error(&a->archive,0x54,"Couldn\'t find out RAR header");
          return L'\xffffffe2';
        }
        request = 0;
        do {
          if (*(long *)((long)pvVar6 + request) == local_38) {
            __archive_read_consume(a,request);
            goto LAB_0062d6fe;
          }
          request_00 = request + 0x10;
          lVar2 = request + 0x18;
          request = request_00;
        } while ((ulong)((long)pvVar6 + lVar2) < (ulong)(local_40 + (long)pvVar6));
        __archive_read_consume(a,request_00);
        lVar7 = lVar7 + request_00;
      } while( true );
    }
LAB_0062d6fe:
    *piVar1 = 1;
  }
  if (piVar1[1] == 0) {
    iVar5 = __archive_read_consume(a,8);
    if (iVar5 != 8) {
      return L'\x01';
    }
    piVar1[1] = 1;
  }
  do {
    do {
      wVar3 = process_base_block(a,entry);
    } while (wVar3 == L'\xfffffff6');
  } while ((wVar3 == L'\0') && ((*(byte *)(piVar1 + 0xb) & 4) != 0));
  return wVar3;
}

Assistant:

static int rar5_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct rar5* rar = get_context(a);
	int ret;

	if(rar->header_initialized == 0) {
		init_header(a);
		if ((ret = try_skip_sfx(a)) < ARCHIVE_WARN)
			return ret;
		rar->header_initialized = 1;
	}

	if(rar->skipped_magic == 0) {
		if(ARCHIVE_OK != consume(a, sizeof(rar5_signature_xor))) {
			return ARCHIVE_EOF;
		}

		rar->skipped_magic = 1;
	}

	do {
		ret = process_base_block(a, entry);
	} while(ret == ARCHIVE_RETRY ||
			(rar->main.endarc > 0 && ret == ARCHIVE_OK));

	return ret;
}